

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variable.cpp
# Opt level: O2

string * __thiscall Variable::get_name_abi_cxx11_(string *__return_storage_ptr__,Variable *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

string Variable::get_name()
{
	return name;
}